

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_widget.h
# Opt level: O1

void __thiscall nesvis::MemoryWidget::draw(MemoryWidget *this)

{
  bool bVar1;
  string local_58;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  ImGui::Begin("Memory viewer",(bool *)0x0,0);
  ImGui::BeginTabBar("##tabs",0);
  bVar1 = ImGui::BeginTabItem("Cpu",(bool *)0x0,0);
  if (bVar1) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Cpu","");
    local_38._8_8_ = 0;
    pcStack_20 = std::
                 _Function_handler<unsigned_char_(unsigned_short),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/application/src/memory_widget.h:32:21)>
                 ::_M_invoke;
    local_28 = std::
               _Function_handler<unsigned_char_(unsigned_short),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/application/src/memory_widget.h:32:21)>
               ::_M_manager;
    local_38._M_unused._M_object = this;
    draw_tab(this,&local_58,&this->cpu_mem_labels_,0xffff,
             (function<unsigned_char_(unsigned_short)> *)&local_38);
    if (local_28 != (code *)0x0) {
      (*local_28)(&local_38,&local_38,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    ImGui::EndTabItem();
  }
  bVar1 = ImGui::BeginTabItem("Ppu",(bool *)0x0,0);
  if (bVar1) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Ppu","");
    local_38._8_8_ = 0;
    pcStack_20 = std::
                 _Function_handler<unsigned_char_(unsigned_short),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/application/src/memory_widget.h:41:21)>
                 ::_M_invoke;
    local_28 = std::
               _Function_handler<unsigned_char_(unsigned_short),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/application/src/memory_widget.h:41:21)>
               ::_M_manager;
    local_38._M_unused._M_object = this;
    draw_tab(this,&local_58,&this->ppu_mem_lables_,0x4000,
             (function<unsigned_char_(unsigned_short)> *)&local_38);
    if (local_28 != (code *)0x0) {
      (*local_28)(&local_38,&local_38,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    ImGui::EndTabItem();
  }
  ImGui::EndTabBar();
  ImGui::End();
  return;
}

Assistant:

void draw() {
        ImGui::Begin("Memory viewer", nullptr);

        ImGui::BeginTabBar("##tabs", ImGuiTabBarFlags_None);

        if (ImGui::BeginTabItem("Cpu")) {
            draw_tab("Cpu",
                    cpu_mem_labels_,
                    0xFFFF,
                    [this](uint16_t address) -> uint8_t {
                        return nes_->mmu().read_byte(address);
                    });
            ImGui::EndTabItem();
        }
        if (ImGui::BeginTabItem("Ppu")) {
            draw_tab("Ppu",
                    ppu_mem_lables_,
                    0x4000,
                    [this](uint16_t address) -> uint8_t {
                        return nes_->ppu_mmu().read_byte(address);
                    });
            ImGui::EndTabItem();
        }

        ImGui::EndTabBar();
        ImGui::End();
    }